

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

void __thiscall BN::divmod(BN *this,BN *bn,BN *div,BN *mod)

{
  ushort uVar1;
  bt *diviser;
  pointer puVar2;
  uint uVar3;
  bt bVar4;
  bool bVar5;
  int iVar6;
  size_t i_1;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  divide_by_zero *this_00;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  pointer puVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  bt d;
  allocator_type local_91;
  BN dividend;
  BN divider;
  vector<unsigned_short,_std::allocator<unsigned_short>_> temp;
  
  diviser = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)diviser;
  if (uVar7 < 3) {
    if (*diviser == 0) {
      this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
      divide_by_zero::divide_by_zero(this_00);
      __cxa_throw(this_00,&divide_by_zero::typeinfo,std::logic_error::~logic_error);
    }
    if (uVar7 == 2) {
      divbase(&dividend,this,diviser);
      operator=(div,&dividend);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&dividend);
      modbase(&dividend,this,
              (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start);
      operator=(mod,&dividend);
      goto LAB_00109dd6;
    }
  }
  bVar5 = operator<(this,bn);
  if (bVar5) {
    bn0();
    operator=(div,&dividend);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&dividend);
    operator=(mod,this);
    return;
  }
  BN(&dividend,this);
  BN(&divider,bn);
  bVar4 = (bt)(0x10000 /
              (ulong)((bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1] + 1));
  d = bVar4;
  if (bVar4 != 1) {
    mulbaseappr(&dividend,&d);
    mulbaseappr(&divider,&d);
  }
  lVar18 = (long)divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&dividend.ba,lVar12 + 2);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&divider.ba,
             ((long)divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 1) + 1);
  lVar16 = lVar18 >> 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&div->ba,(lVar12 - lVar16) + 2);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&temp,lVar16 + 1,&local_91);
  puVar2 = (div->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start + ((lVar12 + 1) - lVar16);
  uVar17 = (lVar12 - lVar16) + 1;
  for (uVar7 = uVar17; uVar7 <= uVar17; uVar7 = uVar7 - 1) {
    lVar12 = uVar7 + lVar16;
    uVar1 = *(ushort *)
             ((long)divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar18 + -2);
    uVar8 = (ulong)*(uint *)(dividend.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar12 + -1) / (ulong)uVar1;
    uVar10 = *(uint *)(dividend.ba.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar12 + -1) % (uint)uVar1;
    iVar6 = (int)uVar8;
    if ((iVar6 == 0x10000) ||
       (((uint)dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar12 + -2] | uVar10 << 0x10) <
        (uint)*(ushort *)
               ((long)divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar18 + -4) * iVar6)) {
      uVar15 = iVar6 - 1;
      uVar8 = (ulong)uVar15;
      uVar10 = uVar10 + uVar1;
      if (uVar10 < 0x10000) {
        uVar3 = iVar6 - 2;
        if (*(ushort *)
             ((long)divider.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar18 + -4) * uVar15 <=
            ((uint)dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar12 + -2] | uVar10 * 0x10000)) {
          uVar3 = uVar15;
        }
        uVar8 = (ulong)uVar3;
      }
    }
    iVar6 = (int)uVar8;
    if (iVar6 == 0) {
      uVar8 = 0;
    }
    else {
      lVar9 = 0;
      for (lVar11 = 0; lVar16 != lVar11; lVar11 = lVar11 + 1) {
        lVar9 = (lVar9 + (ulong)puVar14[lVar11]) -
                (ulong)((uint)divider.ba.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar11] * iVar6);
        puVar14[lVar11] = (unsigned_short)lVar9;
        lVar9 = lVar9 >> 0x10;
      }
      uVar1 = dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar12];
      dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] = (unsigned_short)(lVar9 + (ulong)uVar1);
      if ((long)(lVar9 + (ulong)uVar1) < 0) {
        uVar13 = 0;
        for (lVar9 = 0; lVar16 != lVar9; lVar9 = lVar9 + 1) {
          uVar13 = (ulong)divider.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar9] + uVar13 + puVar14[lVar9];
          puVar14[lVar9] = (unsigned_short)uVar13;
          uVar13 = uVar13 >> 0x10;
        }
        uVar8 = (ulong)(iVar6 - 1);
        dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] =
             dividend.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_start[lVar12] + (short)uVar13;
      }
    }
    puVar2[uVar7] = (unsigned_short)uVar8;
    puVar14 = puVar14 + -1;
  }
  anon_unknown.dwarf_c68a::Norm(&div->ba);
  anon_unknown.dwarf_c68a::Norm(&dividend.ba);
  if (bVar4 != 1) {
    divbaseappr(&dividend,&d);
  }
  operator=(mod,&dividend);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&temp.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&divider);
LAB_00109dd6:
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&dividend);
  return;
}

Assistant:

void BN::divmod(const BN& bn, BN& div, BN& mod) const
{
    if(bn.is0())
        throw divide_by_zero();

    if(bn.ba.size() == 1) {
        div = move(this -> divbase(bn.ba.front()));
        mod = move(this -> modbase(bn.ba.front()));
        return;
    }

    if(*this < bn) {
        div = BN::bn0();
        mod = *this;
        return;
    }

    BN dividend(*this);
    BN divider(bn);

    bt d = bsize  / (bn.ba.back() + 1);
    if (d != 1) {
        dividend.mulbaseappr(d);
        divider.mulbaseappr(d);
    }

    size_t n = divider.ba.size();
    size_t m = dividend.ba.size() - n + 1;

    dividend.ba.resize(dividend.ba.size() + 2);
    divider.ba.resize(divider.ba.size() + 1);

    div.ba.resize(m + 1);

    vector<bt> temp(n + 1);
    for (size_t j = m; j <= m; --j) {
        bt2 q = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) / divider.ba[n-1];
        bt2 r = (dividend.ba[j + n] * bsize + dividend.ba[j + n - 1]) % divider.ba[n-1];

        if (q == bsize || q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2]) {
            --q;
            r += divider.ba[n-1];
            if (r < bsize && q * divider.ba[n-2] > bsize * r + dividend.ba[j + n - 2])
                --q;
        }

        if (!q) {
            div.ba[j] = 0;
            continue;
        }

        bt4s x = 0;
        for (size_t i = 0; i < n; ++i) {
            x += dividend.ba[j + i];
            x -= q * divider.ba[i];
            dividend.ba[j + i] = x;
            x >>= bz8;
        }
        x += dividend.ba[j + n];
        dividend.ba[j + n] = x;

        // If `x' is negative, than `q' is too large.
        // Decrement `q' and update `dividend'.
        if (x < 0) {
            --q;
            x = 0;
            for (size_t i = 0; i < n; ++i) {
                x += dividend.ba[j + i];
                x += divider.ba[i];
                dividend.ba[j + i] = x;
                x >>= bz8;
            }
            x += dividend.ba[j + n];
            dividend.ba[j + n] = x;
        }

        div.ba[j] = q;
    }
    Norm(div.ba);
    Norm(dividend.ba);

    if (d != 1)
        dividend.divbaseappr(d);
    mod = move(dividend);
}